

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.h
# Opt level: O0

bool __thiscall tcmalloc::ThreadCache::FreeList::TryPop(FreeList *this,void **rv)

{
  bool bVar1;
  void **rv_local;
  FreeList *this_local;
  
  bVar1 = SLL_TryPop(&this->list_,rv);
  if (bVar1) {
    this->length_ = this->length_ - 1;
    if (this->length_ < this->lowater_) {
      this->lowater_ = this->length_;
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool TryPop(void **rv) {
      if (SLL_TryPop(&list_, rv)) {
        length_--;
        if (PREDICT_FALSE(length_ < lowater_)) lowater_ = length_;
        return true;
      }
      return false;
    }